

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

bool __thiscall Func::IsInPhase(Func *this,Phase tag)

{
  bool bVar1;
  Func *pFVar2;
  Phase local_12;
  Func *pFStack_10;
  Phase tag_local;
  Func *this_local;
  
  local_12 = tag;
  pFStack_10 = this;
  pFVar2 = GetTopFunc(this);
  bVar1 = JsUtil::Stack<Js::Phase,_Memory::ArenaAllocator,_false,_DefaultComparer>::Contains
                    (&pFVar2->currentPhases,&local_12);
  return bVar1;
}

Assistant:

bool
Func::IsInPhase(Js::Phase tag)
{
    return this->GetTopFunc()->currentPhases.Contains(tag);
}